

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQString *pSVar2;
  bool bVar3;
  SQChar *pSVar4;
  SQObjectValue *dest;
  SQInteger SStack_40;
  SQUnsignedInteger32 _type;
  
  _type = (o->super_SQObject)._type;
  bVar3 = SafeWrite(v,write,up,&_type,4);
  if (bVar3) {
    SVar1 = (o->super_SQObject)._type;
    if (SVar1 != OT_NULL) {
      if ((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) {
        SStack_40 = 8;
LAB_00132f04:
        dest = &(o->super_SQObject)._unVal;
      }
      else {
        if (SVar1 == OT_FLOAT) {
          SStack_40 = 4;
          goto LAB_00132f04;
        }
        if (SVar1 != OT_STRING) {
          pSVar4 = GetTypeName(o);
          SQVM::Raise_Error(v,"cannot serialize a %s",pSVar4);
          return false;
        }
        bVar3 = SafeWrite(v,write,up,
                          &(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).
                           super_SQCollectable._sharedstate,8);
        if (!bVar3) goto LAB_00132f20;
        pSVar2 = (o->super_SQObject)._unVal.pString;
        SStack_40 = pSVar2->_len;
        dest = (SQObjectValue *)pSVar2->_val;
      }
      bVar3 = SafeWrite(v,write,up,dest,SStack_40);
      if (!bVar3) goto LAB_00132f20;
    }
    bVar3 = true;
  }
  else {
LAB_00132f20:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type = (SQUnsignedInteger32)sq_type(o);
    _CHECK_IO(SafeWrite(v,write,up,&_type,sizeof(_type)));
    switch(sq_type(o)){
    case OT_STRING:
        _CHECK_IO(SafeWrite(v,write,up,&_string(o)->_len,sizeof(SQInteger)));
        _CHECK_IO(SafeWrite(v,write,up,_stringval(o),_string(o)->_len));
        break;
    case OT_BOOL:
    case OT_INTEGER:
        _CHECK_IO(SafeWrite(v,write,up,&_integer(o),sizeof(SQInteger)));break;
    case OT_FLOAT:
        _CHECK_IO(SafeWrite(v,write,up,&_float(o),sizeof(SQFloat)));break;
    case OT_NULL:
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),GetTypeName(o));
        return false;
    }
    return true;
}